

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# party.cpp
# Opt level: O0

void __thiscall Party::Party(Party *this,World *world,Character *leader,Character *other)

{
  Party *local_30;
  Character *local_28;
  Character *other_local;
  Character *leader_local;
  World *world_local;
  Party *this_local;
  
  local_28 = other;
  other_local = leader;
  leader_local = (Character *)world;
  world_local = (World *)this;
  std::vector<Character_*,_std::allocator<Character_*>_>::vector(&this->members);
  this->world = (World *)leader_local;
  local_30 = this;
  std::vector<Party_*,_std::allocator<Party_*>_>::push_back(&this->world->parties,&local_30);
  std::vector<Character_*,_std::allocator<Character_*>_>::push_back(&this->members,&other_local);
  std::vector<Character_*,_std::allocator<Character_*>_>::push_back(&this->members,&local_28);
  this->leader = other_local;
  other_local->party = this;
  local_28->party = this;
  this->temp_expsum = 0;
  RefreshMembers(this,other_local,true);
  RefreshMembers(this,local_28,true);
  return;
}

Assistant:

Party::Party(World *world, Character *leader, Character *other)
{
	this->world = world;
	this->world->parties.push_back(this);

	this->members.push_back(leader);
	this->members.push_back(other);

	this->leader = leader;

	leader->party = this;
	other->party = this;

	this->temp_expsum = 0;

	this->RefreshMembers(leader, true);
	this->RefreshMembers(other, true);
}